

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLhandler.c
# Opt level: O0

RDL_pathIterator * RDL_listPaths(uint r,uint p,char mode,RDL_graph *gra,RDL_sPathInfo *spi)

{
  uint uVar1;
  RDL_pathIterator *it_00;
  RDL_stack *pRVar2;
  uint *element;
  RDL_pathIterator *pRVar3;
  RDL_pathIterator *it;
  RDL_lpStackElement *new_element;
  uint number;
  RDL_sPathInfo *spi_local;
  RDL_graph *gra_local;
  char mode_local;
  uint p_local;
  uint r_local;
  
  it_00 = (RDL_pathIterator *)malloc(0x30);
  pRVar2 = RDL_stack_new();
  it_00->stack = pRVar2;
  it_00->mode = mode;
  if (mode == 'a') {
    new_element._4_4_ = gra->V;
  }
  else {
    new_element._4_4_ = gra->E;
  }
  uVar1 = RDL_bitset_init(&it_00->compressed_path,new_element._4_4_);
  it_00->compressed_number = uVar1;
  it_00->spi = spi;
  it_00->gra = gra;
  it_00->end = '\0';
  element = (uint *)malloc(0x18);
  *element = r;
  element[1] = p;
  element[2] = 0;
  element[4] = 0;
  element[5] = 0;
  RDL_stack_push(it_00->stack,element);
  pRVar3 = RDL_pathIteratorNext(it_00);
  if (pRVar3 == (RDL_pathIterator *)0x0) {
    (*RDL_outputFunc)(RDL_ERROR,"Failed iterator initialization!\n");
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rareylab[P]RingDecomposerLib/src/RingDecomposerLib/RDLhandler.c"
                  ,0xec,
                  "RDL_pathIterator *RDL_listPaths(unsigned int, unsigned int, char, const RDL_graph *, const RDL_sPathInfo *)"
                 );
  }
  return it_00;
}

Assistant:

static RDL_pathIterator* RDL_listPaths(unsigned r, unsigned p,
                   char mode, const RDL_graph *gra, const RDL_sPathInfo *spi)
{
  unsigned number;
  RDL_lpStackElement *new_element;

  RDL_pathIterator *it = malloc(sizeof(*it));

  it->stack = RDL_stack_new();
  it->mode = mode;

  if(mode == 'a') {
    number = gra->V;
  }
  else {
    number = gra->E;
  }
  it->compressed_number = RDL_bitset_init(&it->compressed_path, number);

  it->spi = spi;
  it->gra = gra;
  it->end = 0;
  new_element = malloc(sizeof(*new_element));
  new_element->r = r;
  new_element->p = p;
  new_element->ai_index = 0;
  new_element->split_copy = NULL;

  RDL_stack_push(it->stack, new_element);

  if (!RDL_pathIteratorNext(it)) {
    RDL_outputFunc(RDL_ERROR, "Failed iterator initialization!\n");
    /* should never happen */
    assert(0);
    return NULL;
  }

  return it;
}